

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dumps(LispPTR laddr)

{
  LispPTR LVar1;
  DLword *local_18;
  DLword *ptr;
  int i;
  LispPTR laddr_local;
  
  local_18 = NativeAligned2FromLAddr(laddr);
  for (ptr._0_4_ = 0; (int)ptr < 0x28; ptr._0_4_ = (int)ptr + 1) {
    LVar1 = LAddrFromNative(local_18);
    printf("LADDR 0x%x : %d\n",(ulong)LVar1,(ulong)*(ushort *)((ulong)local_18 ^ 2));
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void dumps(LispPTR laddr) {
  int i;
  DLword *ptr;

  ptr = (DLword *)NativeAligned2FromLAddr(laddr);

  for (i = 0; i < 40; i++, ptr++)
    printf("LADDR 0x%x : %d\n", LAddrFromNative(ptr), (GETWORD(ptr) & 0xffff));
}